

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

void __thiscall IndexTree::initFileMap(IndexTree *this)

{
  long in_RDI;
  
  madvise(*(void **)(in_RDI + 0x18),*(size_t *)(in_RDI + 8),1);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x18);
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x20) + 4;
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x28) + 4;
  return;
}

Assistant:

void IndexTree::initFileMap() {
    madvise(file_map, index_file_size, MADV_RANDOM);
    node_count = reinterpret_cast<uint32_t*>(file_map);
    root_node = reinterpret_cast<int32_t*>(node_count + 1);
    nodes = reinterpret_cast<Node*>(root_node + 1);
//    printf("Index file map: %p %p %p\n", node_count, root_node, nodes);
}